

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_uri.c
# Opt level: O0

ares_status_t ares_uri_write_fragment(ares_uri_t *uri,ares_buf_t *buf)

{
  size_t sVar1;
  ares_status_t status;
  ares_buf_t *buf_local;
  ares_uri_t *uri_local;
  
  sVar1 = ares_strlen(uri->fragment);
  if (sVar1 == 0) {
    uri_local._4_4_ = ARES_SUCCESS;
  }
  else {
    uri_local._4_4_ = ares_buf_append_byte(buf,'#');
    if ((uri_local._4_4_ == ARES_SUCCESS) &&
       (uri_local._4_4_ = ares_uri_encode_buf(buf,uri->fragment,ares_uri_chis_fragment),
       uri_local._4_4_ == ARES_SUCCESS)) {
      uri_local._4_4_ = ARES_SUCCESS;
    }
  }
  return uri_local._4_4_;
}

Assistant:

static ares_status_t ares_uri_write_fragment(const ares_uri_t *uri,
                                             ares_buf_t       *buf)
{
  ares_status_t status;

  if (!ares_strlen(uri->fragment)) {
    return ARES_SUCCESS;
  }

  status = ares_buf_append_byte(buf, '#');
  if (status != ARES_SUCCESS) {
    return status;
  }

  status = ares_uri_encode_buf(buf, uri->fragment, ares_uri_chis_fragment);
  if (status != ARES_SUCCESS) {
    return status;
  }

  return ARES_SUCCESS;
}